

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_util.c
# Opt level: O2

int BrotliIsMostlyUTF8(uint8_t *data,size_t pos,size_t mask,size_t length,double min_fraction)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar8 = 0;
  lVar2 = 0;
  do {
    uVar5 = length - uVar8;
    if (length <= uVar8) {
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      auVar11._8_4_ = (int)(length >> 0x20);
      auVar11._0_8_ = length;
      auVar11._12_4_ = 0x45300000;
      return (int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0)) * min_fraction <
                  (auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    }
    uVar9 = uVar8 + pos & mask;
    bVar1 = data[uVar9];
    uVar3 = (uint)bVar1;
    if ((char)bVar1 < '\x01') {
      if (uVar5 < 2) {
LAB_00135af0:
        uVar3 = uVar3 | 0x110000;
        goto LAB_00135af6;
      }
      uVar7 = (uint)bVar1;
      if ((((uVar7 & 0xffffffe0) != 0xc0) || ((data[uVar9 + 1] & 0xffffffc0) != 0x80)) ||
         (uVar6 = (uVar7 & 0x1f) << 6, uVar6 < 0x80)) {
        if (uVar5 != 2) {
          if ((((uVar7 & 0xfffffff0) == 0xe0) && ((data[uVar9 + 1] & 0xc0) == 0x80)) &&
             (((data[uVar9 + 2] & 0xffffffc0) == 0x80 &&
              (uVar7 = (data[uVar9 + 1] & 0x3f) << 6 | (uVar7 & 0xf) << 0xc, 0x7ff < uVar7)))) {
            uVar3 = data[uVar9 + 2] & 0x3f | uVar7;
            lVar4 = 3;
            goto LAB_00135af9;
          }
          if (((3 < uVar5) && ((uVar3 & 0xfffffff8) == 0xf0)) &&
             (((data[uVar9 + 1] & 0xc0) == 0x80 &&
              (((data[uVar9 + 2] & 0xc0) == 0x80 && ((data[uVar9 + 3] & 0xc0) == 0x80)))))) {
            uVar7 = (uVar3 & 7) * 0x40000;
            uVar6 = (data[uVar9 + 1] & 0x3f) * 0x1000;
            if ((uVar6 + uVar7) - 0x10000 < 0x100000) {
              uVar3 = data[uVar9 + 3] & 0x3f | (data[uVar9 + 2] & 0x3f) << 6 | uVar6 | uVar7;
              lVar4 = 4;
              goto LAB_00135af9;
            }
          }
        }
        goto LAB_00135af0;
      }
      uVar3 = data[uVar9 + 1] & 0x3f | uVar6;
      lVar4 = 2;
    }
    else {
LAB_00135af6:
      lVar4 = 1;
    }
LAB_00135af9:
    uVar8 = uVar8 + lVar4;
    if (0x10ffff < uVar3) {
      lVar4 = 0;
    }
    lVar2 = lVar2 + lVar4;
  } while( true );
}

Assistant:

BROTLI_BOOL BrotliIsMostlyUTF8(
    const uint8_t* data, const size_t pos, const size_t mask,
    const size_t length, const double min_fraction) {
  size_t size_utf8 = 0;
  size_t i = 0;
  while (i < length) {
    int symbol;
    size_t bytes_read =
        BrotliParseAsUTF8(&symbol, &data[(pos + i) & mask], length - i);
    i += bytes_read;
    if (symbol < 0x110000) size_utf8 += bytes_read;
  }
  return TO_BROTLI_BOOL((double)size_utf8 > min_fraction * (double)length);
}